

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool DataTypeApplyOpFromText
               (char *buf,char *initial_value_buf,ImGuiDataType data_type,void *data_ptr,
               char *scalar_format)

{
  bool bVar1;
  int iVar2;
  double local_90;
  double arg0f_1;
  double *v_3;
  float *pfStack_78;
  float arg0f;
  float *v_2;
  uint *puStack_68;
  ImU32 arg0i_1;
  ImU32 *v_1;
  int *piStack_58;
  int arg0i;
  int *v;
  int local_48;
  float arg1f;
  int arg1i;
  int data_backup [2];
  char op;
  char *scalar_format_local;
  void *data_ptr_local;
  ImGuiDataType data_type_local;
  char *initial_value_buf_local;
  char *buf_local;
  
  unique0x10000495 = scalar_format;
  initial_value_buf_local = buf;
  while (bVar1 = ImCharIsSpace((int)*initial_value_buf_local), bVar1) {
    initial_value_buf_local = initial_value_buf_local + 1;
  }
  data_backup[0]._3_1_ = *initial_value_buf_local;
  if (((data_backup[0]._3_1_ == '+') || (data_backup[0]._3_1_ == '*')) ||
     (data_backup[0]._3_1_ == '/')) {
    do {
      initial_value_buf_local = initial_value_buf_local + 1;
      bVar1 = ImCharIsSpace((int)*initial_value_buf_local);
    } while (bVar1);
  }
  else {
    data_backup[0]._3_1_ = '\0';
  }
  if (*initial_value_buf_local == '\0') {
    return false;
  }
  if (3 < (int)data_type) {
    __assert_fail("data_type < ImGuiDataType_COUNT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0x2140,
                  "bool DataTypeApplyOpFromText(const char *, const char *, ImGuiDataType, void *, const char *)"
                 );
  }
  if (GDataTypeSize[data_type] < 9) {
    memcpy(&arg1f,data_ptr,GDataTypeSize[data_type]);
    local_48 = 0;
    v._4_4_ = 0.0;
    if (data_type == ImGuiDataType_Int32) {
      if (stack0xffffffffffffffc8 == (char *)0x0) {
        stack0xffffffffffffffc8 = "%d";
      }
      v_1._4_4_ = *data_ptr;
      piStack_58 = (int *)data_ptr;
      if ((data_backup[0]._3_1_ != '\0') &&
         (iVar2 = __isoc99_sscanf(initial_value_buf,stack0xffffffffffffffc8,(long)&v_1 + 4),
         iVar2 < 1)) {
        return false;
      }
      if (data_backup[0]._3_1_ == '+') {
        iVar2 = __isoc99_sscanf(initial_value_buf_local,"%d",&local_48);
        if (iVar2 != 0) {
          *piStack_58 = v_1._4_4_ + local_48;
        }
      }
      else if (data_backup[0]._3_1_ == '*') {
        iVar2 = __isoc99_sscanf(initial_value_buf_local,"%f",(long)&v + 4);
        if (iVar2 != 0) {
          *piStack_58 = (int)((float)v_1._4_4_ * v._4_4_);
        }
      }
      else if (data_backup[0]._3_1_ == '/') {
        iVar2 = __isoc99_sscanf(initial_value_buf_local,"%f",(long)&v + 4);
        if ((iVar2 != 0) && ((v._4_4_ != 0.0 || (NAN(v._4_4_))))) {
          *piStack_58 = (int)((float)v_1._4_4_ / v._4_4_);
        }
      }
      else {
        iVar2 = __isoc99_sscanf(initial_value_buf_local,stack0xffffffffffffffc8,(long)&v_1 + 4);
        if (iVar2 == 1) {
          *piStack_58 = v_1._4_4_;
        }
      }
    }
    else if (data_type == ImGuiDataType_Uint32) {
      if (stack0xffffffffffffffc8 == (char *)0x0) {
        stack0xffffffffffffffc8 = "%u";
      }
      v_2._4_4_ = *data_ptr;
      puStack_68 = (uint *)data_ptr;
      if ((data_backup[0]._3_1_ != '\0') &&
         (iVar2 = __isoc99_sscanf(initial_value_buf,stack0xffffffffffffffc8,(long)&v_2 + 4),
         iVar2 < 1)) {
        return false;
      }
      if (data_backup[0]._3_1_ == '+') {
        iVar2 = __isoc99_sscanf(initial_value_buf_local,"%d",&local_48);
        if (iVar2 != 0) {
          *puStack_68 = (uint)(long)((float)v_2._4_4_ + v._4_4_);
        }
      }
      else if (data_backup[0]._3_1_ == '*') {
        iVar2 = __isoc99_sscanf(initial_value_buf_local,"%f",(long)&v + 4);
        if (iVar2 != 0) {
          *puStack_68 = (uint)(long)((float)v_2._4_4_ * v._4_4_);
        }
      }
      else if (data_backup[0]._3_1_ == '/') {
        iVar2 = __isoc99_sscanf(initial_value_buf_local,"%f",(long)&v + 4);
        if ((iVar2 != 0) && ((v._4_4_ != 0.0 || (NAN(v._4_4_))))) {
          *puStack_68 = (uint)(long)((float)v_2._4_4_ / v._4_4_);
        }
      }
      else {
        iVar2 = __isoc99_sscanf(initial_value_buf_local,stack0xffffffffffffffc8,(long)&v_2 + 4);
        if (iVar2 == 1) {
          *puStack_68 = v_2._4_4_;
        }
      }
    }
    else if (data_type == ImGuiDataType_Float) {
      stack0xffffffffffffffc8 = "%f";
      v_3._4_4_ = *data_ptr;
      pfStack_78 = (float *)data_ptr;
      if ((data_backup[0]._3_1_ != '\0') &&
         (iVar2 = __isoc99_sscanf(initial_value_buf,"%f",(long)&v_3 + 4), iVar2 < 1)) {
        return false;
      }
      iVar2 = __isoc99_sscanf(initial_value_buf_local,stack0xffffffffffffffc8,(long)&v + 4);
      if (iVar2 < 1) {
        return false;
      }
      if (data_backup[0]._3_1_ == '+') {
        *pfStack_78 = v_3._4_4_ + v._4_4_;
      }
      else if (data_backup[0]._3_1_ == '*') {
        *pfStack_78 = v_3._4_4_ * v._4_4_;
      }
      else if (data_backup[0]._3_1_ == '/') {
        if ((v._4_4_ != 0.0) || (NAN(v._4_4_))) {
          *pfStack_78 = v_3._4_4_ / v._4_4_;
        }
      }
      else {
        *pfStack_78 = v._4_4_;
      }
    }
    else if (data_type == ImGuiDataType_Double) {
      stack0xffffffffffffffc8 = "%lf";
      local_90 = *data_ptr;
      arg0f_1 = (double)data_ptr;
      if ((data_backup[0]._3_1_ != '\0') &&
         (iVar2 = __isoc99_sscanf(initial_value_buf,"%lf",&local_90), iVar2 < 1)) {
        return false;
      }
      iVar2 = __isoc99_sscanf(initial_value_buf_local,stack0xffffffffffffffc8,(long)&v + 4);
      if (iVar2 < 1) {
        return false;
      }
      if (data_backup[0]._3_1_ == '+') {
        *(double *)arg0f_1 = local_90 + (double)v._4_4_;
      }
      else if (data_backup[0]._3_1_ == '*') {
        *(double *)arg0f_1 = local_90 * (double)v._4_4_;
      }
      else if (data_backup[0]._3_1_ == '/') {
        if ((v._4_4_ != 0.0) || (NAN(v._4_4_))) {
          *(double *)arg0f_1 = local_90 / (double)v._4_4_;
        }
      }
      else {
        *(double *)arg0f_1 = (double)v._4_4_;
      }
    }
    iVar2 = memcmp(&arg1f,data_ptr,GDataTypeSize[data_type]);
    return iVar2 != 0;
  }
  __assert_fail("GDataTypeSize[data_type] <= sizeof(data_backup)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                ,0x2142,
                "bool DataTypeApplyOpFromText(const char *, const char *, ImGuiDataType, void *, const char *)"
               );
}

Assistant:

static bool DataTypeApplyOpFromText(const char* buf, const char* initial_value_buf, ImGuiDataType data_type, void* data_ptr, const char* scalar_format)
{
    while (ImCharIsSpace((unsigned int)*buf))
        buf++;

    // We don't support '-' op because it would conflict with inputing negative value.
    // Instead you can use +-100 to subtract from an existing value
    char op = buf[0];
    if (op == '+' || op == '*' || op == '/')
    {
        buf++;
        while (ImCharIsSpace((unsigned int)*buf))
            buf++;
    }
    else
    {
        op = 0;
    }
    if (!buf[0])
        return false;

    IM_ASSERT(data_type < ImGuiDataType_COUNT);
    int data_backup[2];
    IM_ASSERT(GDataTypeSize[data_type] <= sizeof(data_backup));
    memcpy(data_backup, data_ptr, GDataTypeSize[data_type]);

    int arg1i = 0;
    float arg1f = 0.0f;
    if (data_type == ImGuiDataType_Int32)
    {
        if (!scalar_format)
            scalar_format = "%d";
        int* v = (int*)data_ptr;
        int arg0i = *v;
        if (op && sscanf(initial_value_buf, scalar_format, &arg0i) < 1)
            return false;
        // Store operand in a float so we can use fractional value for multipliers (*1.1), but constant always parsed as integer so we can fit big integers (e.g. 2000000003) past float precision
        if (op == '+')      { if (sscanf(buf, "%d", &arg1i)) *v = (int)(arg0i + arg1i); }                   // Add (use "+-" to subtract)
        else if (op == '*') { if (sscanf(buf, "%f", &arg1f)) *v = (int)(arg0i * arg1f); }                   // Multiply
        else if (op == '/') { if (sscanf(buf, "%f", &arg1f) && arg1f != 0.0f) *v = (int)(arg0i / arg1f); }  // Divide
        else                { if (sscanf(buf, scalar_format, &arg0i) == 1) *v = arg0i; }                    // Assign integer constant
    }
    else if (data_type == ImGuiDataType_Uint32)
    {
        if (!scalar_format)
            scalar_format = "%u";
        ImU32* v = (unsigned int*)data_ptr;
        ImU32 arg0i = *v;
        if (op && sscanf(initial_value_buf, scalar_format, &arg0i) < 1)
            return false;
        // Store operand in a float so we can use fractional value for multipliers (*1.1), but constant always parsed as integer so we can fit big integers (e.g. 2000000003) past float precision
        if (op == '+')      { if (sscanf(buf, "%d", &arg1i)) *v = (ImU32)(arg0i + arg1f); }                 // Add (use "+-" to subtract)
        else if (op == '*') { if (sscanf(buf, "%f", &arg1f)) *v = (ImU32)(arg0i * arg1f); }                 // Multiply
        else if (op == '/') { if (sscanf(buf, "%f", &arg1f) && arg1f != 0.0f) *v = (ImU32)(arg0i / arg1f); }// Divide
        else                { if (sscanf(buf, scalar_format, &arg0i) == 1) *v = arg0i; }                    // Assign integer constant
    }
    else if (data_type == ImGuiDataType_Float)
    {
        // For floats we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in
        scalar_format = "%f";
        float* v = (float*)data_ptr;
        float arg0f = *v;
        if (op && sscanf(initial_value_buf, scalar_format, &arg0f) < 1)
            return false;
        if (sscanf(buf, scalar_format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_Double)
    {
        scalar_format = "%lf"; // scanf differentiate float/double unlike printf which forces everything to double because of ellipsis
        double* v = (double*)data_ptr;
        double arg0f = *v;
        if (op && sscanf(initial_value_buf, scalar_format, &arg0f) < 1)
            return false;
        if (sscanf(buf, scalar_format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    return memcmp(data_backup, data_ptr, GDataTypeSize[data_type]) != 0;
}